

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O2

void __thiscall
glslang::TReflectionTraverser::visitSymbol(TReflectionTraverser *this,TIntermSymbol *base)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TReflection *pTVar3;
  undefined4 extraout_var_04;
  EShLanguage EVar4;
  
  iVar2 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(base);
  if ((*(uint *)(CONCAT44(extraout_var,iVar2) + 8) & 0x7f) == 5) {
    iVar2 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])(base);
    if ((iVar2 != 0x10) ||
       ((this->reflection->options & EShReflectionSharedStd140UBO) != EShReflectionDefault)) {
      addUniform(this,base);
    }
  }
  if ((this->reflection->options & EShReflectionSharedStd140SSBO) != EShReflectionDefault) {
    iVar2 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(base);
    if ((*(uint *)(CONCAT44(extraout_var_00,iVar2) + 8) & 0x7f) == 6) {
      iVar2 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])(base);
      if (iVar2 == 0x10) {
        iVar2 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(base);
        if ((*(byte *)(CONCAT44(extraout_var_01,iVar2) + 0x10) & 0xf) != 2) {
          iVar2 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(base);
          if ((*(byte *)(CONCAT44(extraout_var_02,iVar2) + 0x10) & 0xf) != 1) goto LAB_0037e69c;
        }
        addUniform(this,base);
      }
    }
  }
LAB_0037e69c:
  pTVar3 = this->reflection;
  EVar4 = this->intermediate->language;
  if (EVar4 == pTVar3->firstStage) {
    iVar2 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(base);
    uVar1 = *(uint *)(CONCAT44(extraout_var_03,iVar2) + 8);
    if (((uVar1 & 0x7f) < 0x1c) && ((0xe300008U >> (uVar1 & 0x1f) & 1) != 0)) goto LAB_0037e6fc;
    pTVar3 = this->reflection;
    EVar4 = this->intermediate->language;
  }
  if (EVar4 == pTVar3->lastStage) {
    iVar2 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(base);
    uVar1 = *(uint *)(CONCAT44(extraout_var_04,iVar2) + 8);
    if (((uVar1 & 0x7f) < 0x1f) && ((0x71c00010U >> (uVar1 & 0x1f) & 1) != 0)) {
LAB_0037e6fc:
      addPipeIOVariable(this,base);
      return;
    }
  }
  return;
}

Assistant:

void TReflectionTraverser::visitSymbol(TIntermSymbol* base)
{
    if (base->getQualifier().storage == EvqUniform) {
        if (base->getBasicType() == EbtBlock) {
            if (reflection.options & EShReflectionSharedStd140UBO) {
                addUniform(*base);
            }
        } else {
            addUniform(*base);
        }
    }

    // #TODO add std140/layout active rules for ssbo, same with ubo.
    // Storage buffer blocks will be collected and expanding in this part.
    if((reflection.options & EShReflectionSharedStd140SSBO) &&
       (base->getQualifier().storage == EvqBuffer && base->getBasicType() == EbtBlock &&
        (base->getQualifier().layoutPacking == ElpStd140 || base->getQualifier().layoutPacking == ElpShared)))
        addUniform(*base);

    if ((intermediate.getStage() == reflection.firstStage && base->getQualifier().isPipeInput()) ||
        (intermediate.getStage() == reflection.lastStage && base->getQualifier().isPipeOutput()))
        addPipeIOVariable(*base);
}